

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O3

void free_list(generic_list *list,short string_arg)

{
  generic_list *pgVar1;
  
  if (list != (generic_list *)0x0) {
    do {
      if (list->orig != (char *)0x0) {
        free(list->orig);
      }
      pgVar1 = list->next;
      free(list);
      list = pgVar1;
    } while (pgVar1 != (generic_list *)0x0);
  }
  return;
}

Assistant:

static
void free_list(struct generic_list *list, short string_arg)
{
  if (list) {
    struct generic_list *tmp;
    while (list)
      {
        tmp = list;
        if (string_arg && list->arg.string_arg)
          free (list->arg.string_arg);
        if (list->orig)
          free (list->orig);
        list = list->next;
        free (tmp);
      }
  }
}